

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::Directory::Replacer<kj::File>_> __thiscall
kj::anon_unknown_8::DiskHandle::replaceFile(DiskHandle *this,PathPtr path,WriteMode mode)

{
  PathPtr finalName;
  bool bVar1;
  NullableValue<kj::String> *other;
  String *pSVar2;
  AutoCloseFd *other_00;
  Clock *clock;
  undefined4 in_register_0000000c;
  Replacer<kj::File> *extraout_RDX;
  String *this_00;
  WriteMode in_R8D;
  Own<kj::Directory::Replacer<kj::File>_> OVar3;
  Own<kj::File> local_130;
  Own<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::File>_> local_120;
  undefined4 local_10c;
  String local_108;
  AutoCloseFd local_f0;
  Own<kj::File> local_e8;
  Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>_> local_d8;
  AutoCloseFd local_c4;
  AutoCloseFd newFd;
  Type local_b0;
  Function<int_(kj::StringPtr)> local_98;
  String *local_88;
  String *pSStack_80;
  Maybe<kj::String> local_78;
  undefined1 local_58 [8];
  NullableValue<kj::String> temp;
  mode_t local_30;
  int newFd_;
  mode_t acl;
  WriteMode mode_local;
  DiskHandle *this_local;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)CONCAT44(in_register_0000000c,mode);
  this_local = (DiskHandle *)path.parts.size_;
  this_00 = path.parts.ptr;
  local_30 = 0x1b6;
  newFd_ = in_R8D;
  _acl = this_00;
  path_local.parts.size_ = (size_t)this;
  bVar1 = has<kj::WriteMode,void>(in_R8D,EXECUTABLE);
  if (bVar1) {
    local_30 = 0x1ff;
  }
  bVar1 = has<kj::WriteMode,void>(newFd_,PRIVATE);
  if (bVar1) {
    local_30 = local_30 & 0x1c0;
  }
  local_88 = (String *)this_local;
  pSStack_80 = path_local.parts.ptr;
  local_b0.newFd_ = (int *)((long)&temp.field_1 + 0x14);
  local_b0.acl = &local_30;
  local_b0.this = (DiskHandle *)this_00;
  Function<int(kj::StringPtr)>::
  Function<kj::(anonymous_namespace)::DiskHandle::replaceFile(kj::PathPtr,kj::WriteMode)const::_lambda(kj::StringPtr)_1_>
            ((Function<int(kj::StringPtr)> *)&local_98,&local_b0);
  finalName.parts.size_ = (size_t)pSStack_80;
  finalName.parts.ptr = local_88;
  createNamedTemporary(&local_78,(DiskHandle *)this_00,finalName,newFd_,&local_98);
  other = kj::_::readMaybe<kj::String>(&local_78);
  kj::_::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_58,other);
  Maybe<kj::String>::~Maybe(&local_78);
  Function<int_(kj::StringPtr)>::~Function(&local_98);
  pSVar2 = kj::_::NullableValue::operator_cast_to_String_((NullableValue *)local_58);
  if (pSVar2 == (String *)0x0) {
    clock = nullClock();
    newInMemoryFile((kj *)&local_130,clock);
    heap<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::File>,kj::Own<kj::File>>
              ((kj *)&local_120,&local_130);
    Own<kj::Directory::Replacer<kj::File>>::
    Own<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::File>,void>
              ((Own<kj::Directory::Replacer<kj::File>> *)this,&local_120);
    Own<kj::(anonymous_namespace)::DiskHandle::BrokenReplacer<kj::File>_>::~Own(&local_120);
    Own<kj::File>::~Own(&local_130);
    local_10c = 1;
  }
  else {
    AutoCloseFd::AutoCloseFd(&local_c4,temp.field_1._20_4_);
    other_00 = mv<kj::AutoCloseFd>(&local_c4);
    AutoCloseFd::AutoCloseFd(&local_f0,other_00);
    newDiskFile((kj *)&local_e8,&local_f0);
    pSVar2 = kj::_::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_58);
    pSVar2 = mv<kj::String>(pSVar2);
    PathPtr::toString(&local_108,(PathPtr *)&this_local,false);
    heap<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,kj::Own<kj::File>,kj::(anonymous_namespace)::DiskHandle_const&,kj::String,kj::String,kj::WriteMode&>
              ((kj *)&local_d8,&local_e8,(DiskHandle *)this_00,pSVar2,&local_108,
               (WriteMode *)&newFd_);
    Own<kj::Directory::Replacer<kj::File>>::
    Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>,void>
              ((Own<kj::Directory::Replacer<kj::File>> *)this,&local_d8);
    Own<kj::(anonymous_namespace)::DiskHandle::ReplacerImpl<kj::File>_>::~Own(&local_d8);
    String::~String(&local_108);
    Own<kj::File>::~Own(&local_e8);
    AutoCloseFd::~AutoCloseFd(&local_f0);
    local_10c = 1;
    AutoCloseFd::~AutoCloseFd(&local_c4);
  }
  kj::_::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_58);
  OVar3.ptr = extraout_RDX;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<Directory::Replacer<File>> replaceFile(PathPtr path, WriteMode mode) const {
    mode_t acl = 0666;
    if (has(mode, WriteMode::EXECUTABLE)) {
      acl = 0777;
    }
    if (has(mode, WriteMode::PRIVATE)) {
      acl &= 0700;
    }

    int newFd_;
    KJ_IF_MAYBE(temp, createNamedTemporary(path, mode,
        [&](StringPtr candidatePath) {
      return newFd_ = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, acl);
    })) {
      AutoCloseFd newFd(newFd_);
#ifndef O_CLOEXEC
      setCloexec(newFd);
#endif
      return heap<ReplacerImpl<File>>(newDiskFile(kj::mv(newFd)), *this, kj::mv(*temp),
                                      path.toString(), mode);
    } else {
      // threw, but exceptions are disabled
      return heap<BrokenReplacer<File>>(newInMemoryFile(nullClock()));
    }